

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_itrans_recon_8x8.c
# Opt level: O0

void ihevc_chroma_itrans_recon_8x8
               (WORD16 *pi2_src,WORD16 *pi2_tmp,UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 src_strd,
               WORD32 pred_strd,WORD32 dst_strd,WORD32 zero_cols,WORD32 zero_rows)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_RCX;
  long in_RDX;
  short *in_RSI;
  short *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  uint in_stack_00000010;
  WORD32 itrans_out_1;
  WORD32 itrans_out;
  WORD32 row_limit_2nd_stage;
  WORD32 zero_rows_2nd_stage;
  WORD32 trans_size;
  WORD16 *pi2_tmp_orig;
  WORD32 shift;
  WORD32 add;
  WORD32 eo [2];
  WORD32 ee [2];
  WORD32 o [4];
  WORD32 e [4];
  WORD32 k;
  WORD32 j;
  char local_dc;
  char local_d8;
  int local_d4;
  int local_d0;
  char local_cc;
  char local_c8;
  int local_c4;
  int local_c0;
  char local_bc;
  char local_b8;
  int local_b4;
  int local_b0;
  char local_ac;
  char local_a8;
  int local_a4;
  int local_a0;
  short local_9c;
  short local_98;
  short local_94;
  short local_90;
  int local_84;
  int aiStack_58 [10];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  long local_18;
  short *local_10;
  short *local_8;
  
  uVar1 = in_stack_00000010;
  if ((in_stack_00000010 & 0xf0) == 0xf0) {
    local_84 = 4;
  }
  else {
    local_84 = 8;
  }
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < local_84; local_2c = local_2c + 1) {
    if ((in_stack_00000010 & 1) == 1) {
      memset(local_10,0,0x10);
    }
    else {
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        aiStack_58[local_30] =
             (int)g_ai2_ihevc_trans_8[1][local_30] * (int)local_8[local_24] +
             (int)g_ai2_ihevc_trans_8[3][local_30] * (int)local_8[local_24 * 3] +
             (int)g_ai2_ihevc_trans_8[5][local_30] * (int)local_8[local_24 * 5] +
             (int)g_ai2_ihevc_trans_8[7][local_30] * (int)local_8[local_24 * 7];
      }
      iVar2 = local_8[local_24 << 1] * 0x53 + local_8[local_24 * 6] * 0x24;
      iVar3 = local_8[local_24 << 1] * 0x24 + local_8[local_24 * 6] * -0x53;
      iVar4 = *local_8 * 0x40 + local_8[local_24 << 2] * 0x40;
      iVar5 = *local_8 * 0x40 + local_8[local_24 << 2] * -0x40;
      aiStack_58[4] = iVar4 + iVar2;
      aiStack_58[7] = iVar4 - iVar2;
      aiStack_58[5] = iVar5 + iVar3;
      aiStack_58[6] = iVar5 - iVar3;
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        if (aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x40 >> 7 < 0x8000) {
          if (aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x40 >> 7 < -0x8000) {
            local_94 = -0x8000;
          }
          else {
            local_94 = (short)(aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x40 >> 7);
          }
          local_90 = local_94;
        }
        else {
          local_90 = 0x7fff;
        }
        local_10[local_30] = local_90;
        if ((aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) + 0x40 >> 7 < 0x8000)
        {
          if ((aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) + 0x40 >> 7 <
              -0x8000) {
            local_9c = -0x8000;
          }
          else {
            local_9c = (short)((aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) +
                               0x40 >> 7);
          }
          local_98 = local_9c;
        }
        else {
          local_98 = 0x7fff;
        }
        local_10[local_30 + 4] = local_98;
      }
    }
    local_8 = local_8 + 1;
    local_10 = local_10 + 8;
    in_stack_00000010 = (int)in_stack_00000010 >> 1;
  }
  if ((uVar1 & 0xf0) == 0xf0) {
    local_10 = in_RSI;
    for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        aiStack_58[local_30] =
             (int)g_ai2_ihevc_trans_8[1][local_30] * (int)local_10[8] +
             (int)g_ai2_ihevc_trans_8[3][local_30] * (int)local_10[0x18];
      }
      aiStack_58[4] = *local_10 * 0x40 + local_10[0x10] * 0x53;
      aiStack_58[7] = *local_10 * 0x40 + local_10[0x10] * -0x53;
      aiStack_58[5] = *local_10 * 0x40 + local_10[0x10] * 0x24;
      aiStack_58[6] = *local_10 * 0x40 + local_10[0x10] * -0x24;
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        if (aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x800 >> 0xc < 0x8000) {
          if (aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x800 >> 0xc < -0x8000) {
            local_a4 = -0x8000;
          }
          else {
            local_a4 = aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x800 >> 0xc;
          }
          local_a0 = local_a4;
        }
        else {
          local_a0 = 0x7fff;
        }
        if ((int)(local_a0 + (uint)*(byte *)(local_18 + (local_30 << 1))) < 0x100) {
          if ((int)(local_a0 + (uint)*(byte *)(local_18 + (local_30 << 1))) < 0) {
            local_ac = '\0';
          }
          else {
            local_ac = (char)local_a0 + *(char *)(local_18 + (local_30 << 1));
          }
          local_a8 = local_ac;
        }
        else {
          local_a8 = -1;
        }
        *(char *)(local_20 + (local_30 << 1)) = local_a8;
        if ((aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) + 0x800 >> 0xc <
            0x8000) {
          if ((aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) + 0x800 >> 0xc <
              -0x8000) {
            local_b4 = -0x8000;
          }
          else {
            local_b4 = (aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) + 0x800 >>
                       0xc;
          }
          local_b0 = local_b4;
        }
        else {
          local_b0 = 0x7fff;
        }
        if ((int)(local_b0 + (uint)*(byte *)(local_18 + (local_30 + 4) * 2)) < 0x100) {
          if ((int)(local_b0 + (uint)*(byte *)(local_18 + (local_30 + 4) * 2)) < 0) {
            local_bc = '\0';
          }
          else {
            local_bc = (char)local_b0 + *(char *)(local_18 + (local_30 + 4) * 2);
          }
          local_b8 = local_bc;
        }
        else {
          local_b8 = -1;
        }
        *(char *)(local_20 + (local_30 + 4) * 2) = local_b8;
      }
      local_10 = local_10 + 1;
      local_18 = local_18 + local_28;
      local_20 = local_20 + in_stack_00000008;
    }
  }
  else {
    local_10 = in_RSI;
    for (local_2c = 0; local_2c < 8; local_2c = local_2c + 1) {
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        aiStack_58[local_30] =
             (int)g_ai2_ihevc_trans_8[1][local_30] * (int)local_10[8] +
             (int)g_ai2_ihevc_trans_8[3][local_30] * (int)local_10[0x18] +
             (int)g_ai2_ihevc_trans_8[5][local_30] * (int)local_10[0x28] +
             (int)g_ai2_ihevc_trans_8[7][local_30] * (int)local_10[0x38];
      }
      iVar2 = local_10[0x10] * 0x53 + local_10[0x30] * 0x24;
      iVar3 = local_10[0x10] * 0x24 + local_10[0x30] * -0x53;
      iVar4 = *local_10 * 0x40 + local_10[0x20] * 0x40;
      iVar5 = *local_10 * 0x40 + local_10[0x20] * -0x40;
      aiStack_58[4] = iVar4 + iVar2;
      aiStack_58[7] = iVar4 - iVar2;
      aiStack_58[5] = iVar5 + iVar3;
      aiStack_58[6] = iVar5 - iVar3;
      for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
        if (aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x800 >> 0xc < 0x8000) {
          if (aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x800 >> 0xc < -0x8000) {
            local_c4 = -0x8000;
          }
          else {
            local_c4 = aiStack_58[(long)local_30 + 4] + aiStack_58[local_30] + 0x800 >> 0xc;
          }
          local_c0 = local_c4;
        }
        else {
          local_c0 = 0x7fff;
        }
        if ((int)(local_c0 + (uint)*(byte *)(local_18 + (local_30 << 1))) < 0x100) {
          if ((int)(local_c0 + (uint)*(byte *)(local_18 + (local_30 << 1))) < 0) {
            local_cc = '\0';
          }
          else {
            local_cc = (char)local_c0 + *(char *)(local_18 + (local_30 << 1));
          }
          local_c8 = local_cc;
        }
        else {
          local_c8 = -1;
        }
        *(char *)(local_20 + (local_30 << 1)) = local_c8;
        if ((aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) + 0x800 >> 0xc <
            0x8000) {
          if ((aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) + 0x800 >> 0xc <
              -0x8000) {
            local_d4 = -0x8000;
          }
          else {
            local_d4 = (aiStack_58[(long)(3 - local_30) + 4] - aiStack_58[3 - local_30]) + 0x800 >>
                       0xc;
          }
          local_d0 = local_d4;
        }
        else {
          local_d0 = 0x7fff;
        }
        if ((int)(local_d0 + (uint)*(byte *)(local_18 + (local_30 + 4) * 2)) < 0x100) {
          if ((int)(local_d0 + (uint)*(byte *)(local_18 + (local_30 + 4) * 2)) < 0) {
            local_dc = '\0';
          }
          else {
            local_dc = (char)local_d0 + *(char *)(local_18 + (local_30 + 4) * 2);
          }
          local_d8 = local_dc;
        }
        else {
          local_d8 = -1;
        }
        *(char *)(local_20 + (local_30 + 4) * 2) = local_d8;
      }
      local_10 = local_10 + 1;
      local_18 = local_18 + local_28;
      local_20 = local_20 + in_stack_00000008;
    }
  }
  return;
}

Assistant:

void ihevc_chroma_itrans_recon_8x8(WORD16 *pi2_src,
                                   WORD16 *pi2_tmp,
                                   UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 src_strd,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 zero_cols,
                                   WORD32 zero_rows)
{
    WORD32 j, k;
    WORD32 e[4], o[4];
    WORD32 ee[2], eo[2];
    WORD32 add;
    WORD32 shift;
    WORD16 *pi2_tmp_orig;
    WORD32 trans_size;
    WORD32 zero_rows_2nd_stage = zero_cols;
    WORD32 row_limit_2nd_stage;
    UNUSED(zero_rows);
    trans_size = TRANS_SIZE_8;

    pi2_tmp_orig = pi2_tmp;

    if((zero_cols & 0xF0) == 0xF0)
        row_limit_2nd_stage = 4;
    else
        row_limit_2nd_stage = TRANS_SIZE_8;

    /* Inverse Transform 1st stage */
    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    {
        /************************************************************************************************/
        /**********************************START - IT_RECON_8x8******************************************/
        /************************************************************************************************/

        for(j = 0; j < row_limit_2nd_stage; j++)
        {
            /* Checking for Zero Cols */
            if((zero_cols & 1) == 1)
            {
                memset(pi2_tmp, 0, trans_size * sizeof(WORD16));
            }
            else
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_src[src_strd]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_src[3 * src_strd]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_src[5 * src_strd]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_src[7 * src_strd];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_src[6 * src_strd];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_src[6 * src_strd];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_src[4 * src_strd];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_src[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_src[4 * src_strd];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    pi2_tmp[k] =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pi2_tmp[k + 4] =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                }
            }
            pi2_src++;
            pi2_tmp += trans_size;
            zero_cols = zero_cols >> 1;
        }

        pi2_tmp = pi2_tmp_orig;

        /* Inverse Transform 2nd stage */
        shift = IT_SHIFT_STAGE_2;
        add = 1 << (shift - 1);

        if((zero_rows_2nd_stage & 0xF0) == 0xF0) /* First 4 rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size];
                }
                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k * 2] = CLIP_U8((itrans_out + pu1_pred[k * 2]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[(k + 4) * 2] =
                                    CLIP_U8((itrans_out + pu1_pred[(k + 4) * 2]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        else /* All rows of output of 1st stage are non-zero */
        {
            for(j = 0; j < trans_size; j++)
            {
                /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
                for(k = 0; k < 4; k++)
                {
                    o[k] = g_ai2_ihevc_trans_8[1][k] * pi2_tmp[trans_size]
                                    + g_ai2_ihevc_trans_8[3][k]
                                                    * pi2_tmp[3 * trans_size]
                                    + g_ai2_ihevc_trans_8[5][k]
                                                    * pi2_tmp[5 * trans_size]
                                    + g_ai2_ihevc_trans_8[7][k]
                                                    * pi2_tmp[7 * trans_size];
                }

                eo[0] = g_ai2_ihevc_trans_8[2][0] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][0] * pi2_tmp[6 * trans_size];
                eo[1] = g_ai2_ihevc_trans_8[2][1] * pi2_tmp[2 * trans_size]
                                + g_ai2_ihevc_trans_8[6][1] * pi2_tmp[6 * trans_size];
                ee[0] = g_ai2_ihevc_trans_8[0][0] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][0] * pi2_tmp[4 * trans_size];
                ee[1] = g_ai2_ihevc_trans_8[0][1] * pi2_tmp[0]
                                + g_ai2_ihevc_trans_8[4][1] * pi2_tmp[4 * trans_size];

                /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
                e[0] = ee[0] + eo[0];
                e[3] = ee[0] - eo[0];
                e[1] = ee[1] + eo[1];
                e[2] = ee[1] - eo[1];
                for(k = 0; k < 4; k++)
                {
                    WORD32 itrans_out;
                    itrans_out =
                                    CLIP_S16(((e[k] + o[k] + add) >> shift));
                    pu1_dst[k * 2] = CLIP_U8((itrans_out + pu1_pred[k * 2]));
                    itrans_out =
                                    CLIP_S16(((e[3 - k] - o[3 - k] + add) >> shift));
                    pu1_dst[(k + 4) * 2] =
                                    CLIP_U8((itrans_out + pu1_pred[(k + 4) * 2]));
                }
                pi2_tmp++;
                pu1_pred += pred_strd;
                pu1_dst += dst_strd;
            }
        }
        /************************************************************************************************/
        /************************************END - IT_RECON_8x8******************************************/
        /************************************************************************************************/
    }
}